

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O2

int64_t duckdb::EnumType::GetPos(LogicalType *type,string_t *key)

{
  PhysicalType PVar1;
  ExtraTypeInfo *pEVar2;
  int64_t iVar3;
  InternalException *this;
  allocator local_41;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  string local_38;
  
  info.ptr = (type->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  PVar1 = type->physical_type_;
  if (PVar1 == UINT32) {
    pEVar2 = optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&info);
    iVar3 = TemplatedGetPos<unsigned_int>((string_map_t<unsigned_int> *)&pEVar2[3].type,key);
  }
  else if (PVar1 == UINT16) {
    pEVar2 = optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&info);
    iVar3 = TemplatedGetPos<unsigned_short>((string_map_t<unsigned_short> *)&pEVar2[3].type,key);
  }
  else {
    if (PVar1 != UINT8) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "ENUM can only have unsigned integers (except UINT64) as physical types",&local_41)
      ;
      InternalException::InternalException(this,&local_38);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pEVar2 = optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&info);
    iVar3 = TemplatedGetPos<unsigned_char>((string_map_t<unsigned_char> *)&pEVar2[3].type,key);
  }
  return iVar3;
}

Assistant:

int64_t EnumType::GetPos(const LogicalType &type, const string_t &key) {
	auto info = type.AuxInfo();
	switch (type.InternalType()) {
	case PhysicalType::UINT8:
		return TemplatedGetPos(info->Cast<EnumTypeInfoTemplated<uint8_t>>().GetValues(), key);
	case PhysicalType::UINT16:
		return TemplatedGetPos(info->Cast<EnumTypeInfoTemplated<uint16_t>>().GetValues(), key);
	case PhysicalType::UINT32:
		return TemplatedGetPos(info->Cast<EnumTypeInfoTemplated<uint32_t>>().GetValues(), key);
	default:
		throw InternalException("ENUM can only have unsigned integers (except UINT64) as physical types");
	}
}